

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O0

void destroy_perDeviceData(HTTPTRANSPORT_PERDEVICE_DATA *perDeviceItem)

{
  HTTPTRANSPORT_PERDEVICE_DATA *perDeviceItem_local;
  
  destroy_deviceId(perDeviceItem);
  destroy_deviceKey(perDeviceItem);
  destroy_deviceSas(perDeviceItem);
  destroy_eventHTTPrelativePath(perDeviceItem);
  destroy_messageHTTPrelativePath(perDeviceItem);
  destroy_eventHTTPrequestHeaders(perDeviceItem);
  destroy_messageHTTPrequestHeaders(perDeviceItem);
  destroy_abandonHTTPrelativePathBegin(perDeviceItem);
  destroy_SASObject(perDeviceItem);
  return;
}

Assistant:

static void destroy_perDeviceData(HTTPTRANSPORT_PERDEVICE_DATA * perDeviceItem)
{
    destroy_deviceId(perDeviceItem);
    destroy_deviceKey(perDeviceItem);
    destroy_deviceSas(perDeviceItem);
    destroy_eventHTTPrelativePath(perDeviceItem);
    destroy_messageHTTPrelativePath(perDeviceItem);
    destroy_eventHTTPrequestHeaders(perDeviceItem);
    destroy_messageHTTPrequestHeaders(perDeviceItem);
    destroy_abandonHTTPrelativePathBegin(perDeviceItem);
    destroy_SASObject(perDeviceItem);
}